

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

cmLinkLineComputer * __thiscall
cmMakefileTargetGenerator::CreateLinkLineComputer
          (cmMakefileTargetGenerator *this,cmOutputConverter *outputConverter,
          cmStateDirectory *stateDir)

{
  cmMakefile *this_00;
  cmGlobalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  int iVar2;
  cmLinkLineComputer *pcVar3;
  undefined4 extraout_var;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"MSVC60","");
  bVar1 = cmMakefile::IsOn(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_01 = this->GlobalGenerator;
  if (bVar1) {
    pcVar3 = cmGlobalGenerator::CreateMSVC60LinkLineComputer
                       ((cmGlobalGenerator *)this_01,outputConverter,stateDir);
  }
  else {
    iVar2 = (*(this_01->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[0xe])(this_01,outputConverter,stateDir);
    pcVar3 = (cmLinkLineComputer *)CONCAT44(extraout_var,iVar2);
  }
  return pcVar3;
}

Assistant:

cmLinkLineComputer* cmMakefileTargetGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter, cmStateDirectory const& stateDir)
{
  if (this->Makefile->IsOn("MSVC60")) {
    return this->GlobalGenerator->CreateMSVC60LinkLineComputer(outputConverter,
                                                               stateDir);
  }
  return this->GlobalGenerator->CreateLinkLineComputer(outputConverter,
                                                       stateDir);
}